

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::mask_blit_dst
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  uint64_t _a;
  long local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  ulong local_78;
  ulong local_70;
  uint64_t local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  Image *local_40;
  long local_38;
  
  lVar1 = source->width;
  lVar4 = source->height;
  if (w < 0) {
    w = lVar1;
  }
  if (h < 0) {
    h = lVar4;
  }
  uVar5 = sx >> 0x3f & sx;
  local_50 = x - uVar5;
  lVar9 = 0;
  if (sx < 1) {
    sx = lVar9;
  }
  uVar6 = sy >> 0x3f & sy;
  local_48 = y - uVar6;
  if (sy < 1) {
    sy = lVar9;
  }
  local_58 = 0;
  if (0 < local_50) {
    local_58 = local_50;
  }
  if (-1 < local_50) {
    local_50 = lVar9;
  }
  uVar5 = uVar5 + w + local_50;
  local_50 = sx - local_50;
  local_60 = 0;
  if (0 < local_48) {
    local_60 = local_48;
  }
  if (-1 < local_48) {
    local_48 = lVar9;
  }
  uVar7 = uVar6 + h + local_48;
  local_48 = sy - local_48;
  uVar6 = lVar1 - local_50;
  if ((long)(uVar5 + local_50) <= lVar1) {
    uVar6 = uVar5;
  }
  uVar5 = lVar4 - local_48;
  if ((long)(uVar7 + local_48) <= lVar4) {
    uVar5 = uVar7;
  }
  local_70 = this->width - local_58;
  if ((long)(uVar6 + local_58) <= this->width) {
    local_70 = uVar6;
  }
  local_78 = this->height - local_60;
  if ((long)(uVar5 + local_60) <= this->height) {
    local_78 = uVar5;
  }
  bVar10 = -1 < (long)(local_70 | local_78);
  if ((bVar10) && (bVar11 = -1 < (long)local_78, 0 < (long)local_78)) {
    bVar2 = 0 < (long)local_70;
    local_98 = 0;
    local_40 = source;
    do {
      if (bVar2 && bVar11) {
        lVar1 = local_98 + local_60;
        local_38 = local_48 + local_98;
        lVar8 = 1;
        lVar4 = local_58;
        lVar9 = local_50;
        do {
          read_pixel(this,lVar4,lVar1,&local_80,&local_88,&local_90,&local_68);
          if (((local_80 == r) && (local_88 == g)) && (local_90 == b)) {
            read_pixel(local_40,lVar9,local_38,&local_80,&local_88,&local_90,&local_68);
            write_pixel(this,lVar4,lVar1,local_80,local_88,local_90,local_68);
          }
          bVar3 = lVar8 < (long)local_70;
          lVar9 = lVar9 + 1;
          lVar4 = lVar4 + 1;
          lVar8 = lVar8 + 1;
        } while (bVar10 && bVar3);
      }
      local_98 = local_98 + 1;
    } while (bVar10 && local_98 < (long)local_78);
  }
  return;
}

Assistant:

void Image::mask_blit_dst(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      this->read_pixel(x + xx, y + yy, &_r, &_g, &_b, &_a);
      if (r == _r && g == _g && b == _b) {
        source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}